

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

unique_ptr<wasm_externtype_t,_std::default_delete<wasm_externtype_t>_> __thiscall
wasm_externtype_t::Clone(wasm_externtype_t *this)

{
  ExternType *in_RAX;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))(&local_18);
  New(this,(unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *)
           &local_18);
  if (local_18._M_head_impl != (ExternType *)0x0) {
    (*(local_18._M_head_impl)->_vptr_ExternType[1])();
  }
  return (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<wasm_externtype_t> Clone() const { return New(I->Clone()); }